

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.cpp
# Opt level: O0

KBOOL __thiscall KDIS::KDataStream::operator==(KDataStream *this,KDataStream *Value)

{
  bool bVar1;
  KDataStream *Value_local;
  KDataStream *this_local;
  
  bVar1 = std::operator!=(&this->m_vBuffer,&Value->m_vBuffer);
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

KBOOL KDataStream::operator == ( const KDataStream & Value ) const
{
    if( m_vBuffer != Value.m_vBuffer ) return false;
    return true;
}